

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_upvalbarrier_(lua_State *L,GCObject *o)

{
  global_State *g;
  GCObject *o_local;
  lua_State *L_local;
  
  if (L->l_G->gcstate < 3) {
    if ((o->marked & 0x18) != 0) {
      if (9 < (o->tt & 0xf)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x12d,"void luaC_upvalbarrier_(lua_State *, GCObject *)");
      }
      reallymarkobject(L->l_G,o);
    }
    if ((o->marked & 7) < 2) {
      o->marked = o->marked & 0xf8 | 2;
    }
  }
  return;
}

Assistant:

void luaC_upvalbarrier_(lua_State* L, GCObject* o) {
  global_State* g = G(L);
  if (keepinvariant(g)) {
    markobject(g, o);
    if (!isold(o)) {
      setage(o, G_OLD0);
    }
  }
}